

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int loop(void)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  long *plVar3;
  string command;
  Command cmd;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  Command local_70;
  
  bVar1 = false;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> ",4);
    get_command_abi_cxx11_();
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_90,local_88 + (long)local_90);
    Command::Command(&local_70,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
    iVar2 = std::__cxx11::string::compare((char *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = Command::execute(&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Return code for [",0x11);
      Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(this,"] : ",4);
      plVar3 = (long *)std::ostream::operator<<(this,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::ostream::flush();
    }
    Command::~Command(&local_70);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  } while (!bVar1);
  return 0;
}

Assistant:

int loop()
{
    bool finished(false);
    while (!finished)
    {
        print_prompt();
        std::string command = get_command();
        Command cmd = Command{command};

        if (cmd.get_command_name() == "exit")
        {
            finished = true;
        }
        else
        {
            int return_code = cmd.execute();
            std::cout << "Return code for [" << cmd.get_command_name() << "] : " << return_code << std::endl;
            std::cout.flush();
        }
    }
    return 0;
}